

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O3

bool __thiscall glslang::TConstUnionArray::operator==(TConstUnionArray *this,TConstUnionArray *rhs)

{
  TConstUnionVector *pTVar1;
  TConstUnionVector *pTVar2;
  TConstUnion *pTVar3;
  bool bVar4;
  bool bVar5;
  TConstUnion *this_00;
  pointer constant;
  
  pTVar1 = this->unionArray;
  pTVar2 = rhs->unionArray;
  bVar5 = true;
  bVar4 = true;
  if (pTVar1 != pTVar2) {
    if (pTVar2 != (TConstUnionVector *)0x0 && pTVar1 != (TConstUnionVector *)0x0) {
      this_00 = (pTVar1->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (pTVar1->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      constant = (pTVar2->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                 .
                 super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar3 - (long)this_00 ==
          (long)(pTVar2->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)constant) {
        for (; this_00 != pTVar3; this_00 = this_00 + 1) {
          bVar5 = TConstUnion::operator==(this_00,constant);
          if (!bVar5) {
            return bVar5;
          }
          constant = constant + 1;
        }
      }
      else {
        bVar5 = false;
      }
      return bVar5;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const TConstUnionArray& rhs) const
    {
        // this includes the case that both are unallocated
        if (unionArray == rhs.unionArray)
            return true;

        if (! unionArray || ! rhs.unionArray)
            return false;

        return *unionArray == *rhs.unionArray;
    }